

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numfmt.cpp
# Opt level: O0

void __thiscall icu_63::NumberFormat::NumberFormat(NumberFormat *this)

{
  NumberFormat *this_local;
  
  Format::Format(&this->super_Format);
  (this->super_Format).super_UObject._vptr_UObject = (_func_int **)&PTR__NumberFormat_0049bd60;
  (this->super_Format).field_0x142 = 1;
  *(undefined4 *)&(this->super_Format).field_0x144 = 2000000000;
  this->fMinIntegerDigits = 1;
  this->fMaxFractionDigits = 3;
  this->fMinFractionDigits = 0;
  this->fParseIntegerOnly = '\0';
  this->fLenient = '\0';
  this->fCapitalizationContext = UDISPCTX_CAPITALIZATION_NONE;
  this->fCurrency[0] = L'\0';
  return;
}

Assistant:

NumberFormat::NumberFormat()
:   fGroupingUsed(TRUE),
    fMaxIntegerDigits(gDefaultMaxIntegerDigits),
    fMinIntegerDigits(1),
    fMaxFractionDigits(3), // invariant, >= minFractionDigits
    fMinFractionDigits(0),
    fParseIntegerOnly(FALSE),
    fLenient(FALSE),
    fCapitalizationContext(UDISPCTX_CAPITALIZATION_NONE)
{
    fCurrency[0] = 0;
}